

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

ParameterizedTestCaseInfo<DriverTest> *
testing::internal::
CheckedDowncastToActualType<testing::internal::ParameterizedTestCaseInfo<DriverTest>,testing::internal::ParameterizedTestCaseInfoBase>
          (ParameterizedTestCaseInfoBase *base)

{
  bool bVar1;
  ostream *poVar2;
  ParameterizedTestCaseInfo<DriverTest> *local_48;
  GTestLog local_14;
  ParameterizedTestCaseInfoBase *local_10;
  ParameterizedTestCaseInfoBase *base_local;
  
  local_10 = base;
  if (base == (ParameterizedTestCaseInfoBase *)0x0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)base->_vptr_ParameterizedTestCaseInfoBase[-1],
                     (type_info *)&ParameterizedTestCaseInfo<DriverTest>::typeinfo);
  bVar1 = IsTrue(bVar1);
  if (!bVar1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/third/gtest-1.7.0/include/gtest/internal/gtest-port.h"
                       ,0x47b);
    poVar2 = GTestLog::GetStream(&local_14);
    std::operator<<(poVar2,"Condition typeid(*base) == typeid(Derived) failed. ");
    GTestLog::~GTestLog(&local_14);
  }
  if (local_10 == (ParameterizedTestCaseInfoBase *)0x0) {
    local_48 = (ParameterizedTestCaseInfo<DriverTest> *)0x0;
  }
  else {
    local_48 = (ParameterizedTestCaseInfo<DriverTest> *)
               __dynamic_cast(local_10,&ParameterizedTestCaseInfoBase::typeinfo,
                              &ParameterizedTestCaseInfo<DriverTest>::typeinfo,0);
  }
  return local_48;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}